

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void SparseKeygenRecurse<Blob<320>,Blob<160>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<320> *k,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  Blob<160> h;
  value_type local_48;
  
  local_48.bytes[0] = '\0';
  local_48.bytes[1] = '\0';
  local_48.bytes[2] = '\0';
  local_48.bytes[3] = '\0';
  local_48.bytes[4] = '\0';
  local_48.bytes[5] = '\0';
  local_48.bytes[6] = '\0';
  local_48.bytes[7] = '\0';
  local_48.bytes[8] = '\0';
  local_48.bytes[9] = '\0';
  local_48.bytes[10] = '\0';
  local_48.bytes[0xb] = '\0';
  local_48.bytes[0xc] = '\0';
  local_48.bytes[0xd] = '\0';
  local_48.bytes[0xe] = '\0';
  local_48.bytes[0xf] = '\0';
  local_48.bytes[0x10] = '\0';
  local_48.bytes[0x11] = '\0';
  local_48.bytes[0x12] = '\0';
  local_48.bytes[0x13] = '\0';
  if (start < 0x140) {
    do {
      flipbit(k,0x28,start);
      if (bitsleft == 1 || inclusive) {
        (*hash)(k,0x28,0,&local_48);
        std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,&local_48);
      }
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<320>,Blob<160>>(hash,start + 1,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0x28,start);
      start = start + 1;
    } while (start != 0x140);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}